

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_controller_io.h
# Opt level: O0

void __thiscall
n_e_s::core::MemBankControllerIO::write_byte(MemBankControllerIO *this,uint16_t addr,uint8_t data)

{
  uint8_t data_local;
  uint16_t addr_local;
  MemBankControllerIO *this_local;
  
  if (addr == this->controller1_addr_) {
    if (((this->data1_ & 1) == 1) && ((data & 1) == 0)) {
      this->read_cnt1_ = '\0';
      this->read_cnt2_ = '\0';
    }
    this->data1_ = data;
  }
  else if (addr == this->controller2_addr_) {
    this->data2_ = data;
  }
  return;
}

Assistant:

void write_byte(uint16_t addr, uint8_t data) override {
        if (addr == controller1_addr_) {
            if (((data1_ & static_cast<uint8_t>(0x01)) == 0x01) &&
                    ((data & static_cast<uint8_t>(0x01)) == 0x00)) {
                // Neg flank on bit 0 should latch controller button states -
                // here just make sure counters is reset
                read_cnt1_ = 0;
                read_cnt2_ = 0;
            }
            data1_ = data;
        } else if (addr == controller2_addr_) {
            data2_ = data;
        }
    }